

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferOperationsViaTransformFeedback::initializeBufferObjectData
          (TextureBufferOperationsViaTransformFeedback *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  GLint GVar6;
  ContextType type;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  reference pvVar8;
  TestError *this_00;
  char *local_a0;
  char *vsCode;
  char *fsCode;
  string vsSource;
  string fsSource;
  char *varyings [1];
  allocator<int> local_31;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> data;
  Functions *gl;
  TextureBufferOperationsViaTransformFeedback *this_local;
  
  pRVar7 = deqp::Context::getRenderContext
                     ((this->super_TextureBufferOperations).super_TestCaseBase.m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  iVar3 = (this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,(ulong)(uint)(iVar3 << 2),&local_31);
  std::allocator<int>::~allocator(&local_31);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,0);
  (*(this->super_TextureBufferOperations).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])
            (this,pvVar8,
             (ulong)(uint)((this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture << 2)
            );
  (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 0x1c2))(1,&this->m_tf_vao_id);
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error generating vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x486);
  (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 0x36))(this->m_tf_vao_id);
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x489);
  (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 0x1b2))(1,&this->m_tf_vbo_id);
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error generating vertex buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x48d);
  (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 0x10))(0x8892,this->m_tf_vbo_id);
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error binding vertex buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x490);
  pcVar1 = *(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0x54);
  iVar3 = (this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,0);
  (*pcVar1)(0x8892,(ulong)(uint)(iVar3 << 2) << 2,pvVar8,0x88e8);
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error allocating buffer object\'s data store!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x494);
  GVar5 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0xf2))();
  this->m_tf_po_id = GVar5;
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x497);
  fsSource.field_2._8_8_ = anon_var_dwarf_883921;
  (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 0x532))
            (this->m_tf_po_id,1,(undefined1 *)((long)&fsSource.field_2 + 8),0x8c8d);
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error specifying transform feedback varyings!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x49c);
  GVar5 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0xfc))(0x8b30);
  this->m_tf_fs_id = GVar5;
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error creating fragment shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x49f);
  GVar5 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0xfc))(0x8b31);
  this->m_tf_vs_id = GVar5;
  dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar4,"Error creating vertex shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                  ,0x4a2);
  getTFFragmentShaderCode_abi_cxx11_((string *)((long)&vsSource.field_2 + 8),this);
  getTFVertexShaderCode_abi_cxx11_((string *)&fsCode,this);
  vsCode = (char *)std::__cxx11::string::c_str();
  local_a0 = (char *)std::__cxx11::string::c_str();
  bVar2 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,this->m_tf_po_id,this->m_tf_fs_id,1,&vsCode,
                     this->m_tf_vs_id,1,&local_a0,(bool *)0x0);
  if (bVar2) {
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x5a0))(this->m_tf_po_id);
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error setting active program object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b0);
    GVar6 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x1e0))
                      (this->m_tf_po_id,"inPosition");
    this->m_position_location = GVar6;
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error getting attrib location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b3);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x656))(this->m_position_location,4,0x1404,0,0);
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error setting vertex attrib pointer!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b6);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x184))(this->m_position_location);
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error enabling vertex attrib array!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4b9);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x12))
              (0x8c8e,0,(this->super_TextureBufferOperations).m_tb_bo_id);
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error binding buffer object to transform feedback binding point!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4bc);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0xc))(0);
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error starting transform feedback!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4bf);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x14e))
              (0,0,(this->super_TextureBufferOperations).m_n_vectors_in_buffer_texture);
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error during rendering!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4c3);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x18e))();
    dVar4 = (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar4,"Error ending transform feedback!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
                    ,0x4c6);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x12))(0x8c8e,0);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x10))(0x8892,0);
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x36))(0);
    pRVar7 = deqp::Context::getRenderContext
                       ((this->super_TextureBufferOperations).super_TestCaseBase.m_context);
    type.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
    bVar2 = glu::isContextTypeES(type);
    if (bVar2) {
      (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x146))(this->m_position_location);
    }
    (**(code **)(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 0x5a0))(0);
    this->m_position_location = -1;
    std::__cxx11::string::~string((string *)&fsCode);
    std::__cxx11::string::~string((string *)(vsSource.field_2._M_local_buf + 8));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not create a program from valid vertex/fragment shader code!",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferOperations.cpp"
             ,0x4ac);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TextureBufferOperationsViaTransformFeedback::initializeBufferObjectData()
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::vector<glw::GLint> data(m_n_vectors_in_buffer_texture * m_n_vector_components);
	fillBufferWithData(&data[0], m_n_vectors_in_buffer_texture * m_n_vector_components);

	/* Configure vertex array object */
	gl.genVertexArrays(1, &m_tf_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating vertex array object!");

	gl.bindVertexArray(m_tf_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Configure buffer object*/
	gl.genBuffers(1, &m_tf_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating vertex buffer object!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_tf_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex buffer object!");

	gl.bufferData(GL_ARRAY_BUFFER, m_n_vectors_in_buffer_texture * m_n_vector_components * sizeof(glw::GLint), &data[0],
				  GL_DYNAMIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer object's data store!");

	m_tf_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	/* Setup transform feedback varyings */
	const char* varyings[] = { "outPosition" };
	gl.transformFeedbackVaryings(m_tf_po_id, 1, varyings, GL_SEPARATE_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error specifying transform feedback varyings!");

	m_tf_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating fragment shader object!");

	m_tf_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating vertex shader object!");

	std::string fsSource = getTFFragmentShaderCode();
	std::string vsSource = getTFVertexShaderCode();

	const char* fsCode = fsSource.c_str();
	const char* vsCode = vsSource.c_str();

	if (!buildProgram(m_tf_po_id, m_tf_fs_id, 1, &fsCode, m_tf_vs_id, 1, &vsCode))
	{
		TCU_FAIL("Could not create a program from valid vertex/fragment shader code!");
	}

	gl.useProgram(m_tf_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active program object!");

	m_position_location = gl.getAttribLocation(m_tf_po_id, "inPosition");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting attrib location!");

	gl.vertexAttribIPointer(m_position_location, m_n_vector_components, GL_INT, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting vertex attrib pointer!");

	gl.enableVertexAttribArray(m_position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error enabling vertex attrib array!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_tb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding buffer object to transform feedback binding point!");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error starting transform feedback!");

	/* Render */
	gl.drawArrays(GL_POINTS, 0, m_n_vectors_in_buffer_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error during rendering!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error ending transform feedback!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindVertexArray(0);

	if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		gl.disableVertexAttribArray(m_position_location);

	gl.useProgram(0);

	m_position_location = -1;
}